

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O3

void __thiscall
kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
          (ExternalMutexGuarded<capnp::compiler::BrandedDecl> *this)

{
  BrandScope *pBVar1;
  Disposer *pDVar2;
  BrandedDecl local_b8;
  
  if (this->mutex != (Mutex *)0x0) {
    kj::_::Mutex::lock(this->mutex,0);
    local_b8.body.tag = 0;
    local_b8.brand.disposer = (Disposer *)0x0;
    local_b8.brand.ptr = (BrandScope *)0x0;
    local_b8.source._reader.segment = (SegmentReader *)0x0;
    local_b8.source._reader.capTable = (CapTableReader *)0x0;
    local_b8.source._reader.data = (void *)0x0;
    local_b8.source._reader.pointers._0_6_ = 0;
    local_b8.source._reader.pointers._6_2_ = 0;
    local_b8.source._reader.dataSize = 0;
    local_b8.source._reader.pointerCount = 0;
    local_b8.source._reader.nestingLimit = 0x7fffffff;
    capnp::compiler::BrandedDecl::operator=(&this->value,&local_b8);
    if (local_b8.brand.ptr != (BrandScope *)0x0) {
      local_b8.brand.ptr = (BrandScope *)0x0;
      (**(local_b8.brand.disposer)->_vptr_Disposer)();
    }
    kj::_::Mutex::unlock(this->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  pBVar1 = (this->value).brand.ptr;
  if (pBVar1 != (BrandScope *)0x0) {
    (this->value).brand.ptr = (BrandScope *)0x0;
    pDVar2 = (this->value).brand.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  if ((this->value).body.tag - 1 < 2) {
    (this->value).body.tag = 0;
  }
  return;
}

Assistant:

~ExternalMutexGuarded() noexcept(false) {
    if (mutex != nullptr) {
      mutex->lock(_::Mutex::EXCLUSIVE, kj::none, location);
      KJ_DEFER(mutex->unlock(_::Mutex::EXCLUSIVE));
      value = T();
    }
  }